

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

void __thiscall
obx::BoxTypeless::BoxTypeless(BoxTypeless *this,Store *store,obx_schema_id entityTypeId)

{
  OBX_store *pOVar1;
  OBX_box *pOVar2;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this->store_ = store;
  pOVar1 = Store::cPtr(store);
  pOVar2 = (OBX_box *)obx_box(pOVar1,entityTypeId);
  this->cBox_ = pOVar2;
  this->entityTypeId_ = entityTypeId;
  if (pOVar2 == (OBX_box *)0x0) {
    std::__cxx11::to_string(&local_38,entityTypeId);
    std::operator+(&local_58,"Can not create box for entity type ID ",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    internal::checkPtrOrThrow(this->cBox_,local_58._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

BoxTypeless(Store& store, obx_schema_id entityTypeId)
        : store_(store), cBox_(obx_box(store.cPtr(), entityTypeId)), entityTypeId_(entityTypeId) {
        if (cBox_ == nullptr) {
            std::string msg = "Can not create box for entity type ID " + std::to_string(entityTypeId_);
            internal::checkPtrOrThrow(cBox_, msg.c_str());
        }
    }